

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

value_type *
phmap::priv::NodeHashMapPolicy<int,int>::
new_element<std::allocator<std::pair<int_const,int>>,std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<>>
          (allocator<std::pair<const_int,_int>_> *alloc,piecewise_construct_t *args,
          tuple<int_&&> *args_1,tuple<> *args_2)

{
  pointer p;
  value_type *res;
  tuple<> *ptStack_28;
  PairAlloc pair_alloc;
  tuple<> *args_local_2;
  tuple<int_&&> *args_local_1;
  piecewise_construct_t *args_local;
  allocator<std::pair<const_int,_int>_> *alloc_local;
  
  ptStack_28 = args_2;
  std::allocator<std::pair<const_int,_int>_>::allocator
            ((allocator<std::pair<const_int,_int>_> *)((long)&res + 7),alloc);
  p = allocator_traits<std::allocator<std::pair<const_int,_int>_>_>::allocate
                ((allocator<std::pair<const_int,_int>_> *)((long)&res + 7),1);
  allocator_traits<std::allocator<std::pair<int_const,int>>>::
  construct<std::pair<int_const,int>,std::piecewise_construct_t_const&,std::tuple<int&&>,std::tuple<>>
            ((allocator<std::pair<const_int,_int>_> *)((long)&res + 7),p,args,args_1,ptStack_28);
  std::allocator<std::pair<const_int,_int>_>::~allocator
            ((allocator<std::pair<const_int,_int>_> *)((long)&res + 7));
  return p;
}

Assistant:

static value_type* new_element(Allocator* alloc, Args&&... args) {
        using PairAlloc = typename phmap::allocator_traits<
            Allocator>::template rebind_alloc<value_type>;
        PairAlloc pair_alloc(*alloc);
        value_type* res =
            phmap::allocator_traits<PairAlloc>::allocate(pair_alloc, 1);
        phmap::allocator_traits<PairAlloc>::construct(pair_alloc, res,
                                                      std::forward<Args>(args)...);
        return res;
    }